

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

char Game::getch(void)

{
  int iVar1;
  termios old_settings;
  termios local_98;
  termios local_58;
  
  local_58.c_cc[0x1f] = '\0';
  local_58._49_3_ = 0;
  local_58.c_ispeed = 0;
  local_58.c_ospeed = 0;
  local_58.c_cc[0xf] = '\0';
  local_58.c_cc[0x10] = '\0';
  local_58.c_cc[0x11] = '\0';
  local_58.c_cc[0x12] = '\0';
  local_58.c_cc[0x13] = '\0';
  local_58.c_cc[0x14] = '\0';
  local_58.c_cc[0x15] = '\0';
  local_58.c_cc[0x16] = '\0';
  local_58.c_cc[0x17] = '\0';
  local_58.c_cc[0x18] = '\0';
  local_58.c_cc[0x19] = '\0';
  local_58.c_cc[0x1a] = '\0';
  local_58.c_cc[0x1b] = '\0';
  local_58.c_cc[0x1c] = '\0';
  local_58.c_cc[0x1d] = '\0';
  local_58.c_cc[0x1e] = '\0';
  local_58.c_line = '\0';
  local_58.c_cc[0] = '\0';
  local_58.c_cc[1] = '\0';
  local_58.c_cc[2] = '\0';
  local_58.c_cc[3] = '\0';
  local_58.c_cc[4] = '\0';
  local_58.c_cc[5] = '\0';
  local_58.c_cc[6] = '\0';
  local_58.c_cc[7] = '\0';
  local_58.c_cc[8] = '\0';
  local_58.c_cc[9] = '\0';
  local_58.c_cc[10] = '\0';
  local_58.c_cc[0xb] = '\0';
  local_58.c_cc[0xc] = '\0';
  local_58.c_cc[0xd] = '\0';
  local_58.c_cc[0xe] = '\0';
  local_58.c_iflag = 0;
  local_58.c_oflag = 0;
  local_58.c_cflag = 0;
  local_58.c_lflag = 0;
  local_98.c_cc[0x1f] = '\0';
  local_98._49_3_ = 0;
  local_98.c_ispeed = 0;
  local_98.c_ospeed = 0;
  local_98.c_cc[0xf] = '\0';
  local_98.c_cc[0x10] = '\0';
  local_98.c_cc[0x11] = '\0';
  local_98.c_cc[0x12] = '\0';
  local_98.c_cc[0x13] = '\0';
  local_98.c_cc[0x14] = '\0';
  local_98.c_cc[0x15] = '\0';
  local_98.c_cc[0x16] = '\0';
  local_98.c_cc[0x17] = '\0';
  local_98.c_cc[0x18] = '\0';
  local_98.c_cc[0x19] = '\0';
  local_98.c_cc[0x1a] = '\0';
  local_98.c_cc[0x1b] = '\0';
  local_98.c_cc[0x1c] = '\0';
  local_98.c_cc[0x1d] = '\0';
  local_98.c_cc[0x1e] = '\0';
  local_98.c_line = '\0';
  local_98.c_cc[0] = '\0';
  local_98.c_cc[1] = '\0';
  local_98.c_cc[2] = '\0';
  local_98.c_cc[3] = '\0';
  local_98.c_cc[4] = '\0';
  local_98.c_cc[5] = '\0';
  local_98.c_cc[6] = '\0';
  local_98.c_cc[7] = '\0';
  local_98.c_cc[8] = '\0';
  local_98.c_cc[9] = '\0';
  local_98.c_cc[10] = '\0';
  local_98.c_cc[0xb] = '\0';
  local_98.c_cc[0xc] = '\0';
  local_98.c_cc[0xd] = '\0';
  local_98.c_cc[0xe] = '\0';
  local_98.c_iflag = 0;
  local_98.c_oflag = 0;
  local_98.c_cflag = 0;
  local_98.c_lflag = 0;
  tcgetattr(0,&local_58);
  local_98.c_iflag = local_58.c_iflag;
  local_98.c_oflag = local_58.c_oflag;
  local_98.c_line = local_58.c_line;
  local_98.c_cc[0] = local_58.c_cc[0];
  local_98.c_cc[1] = local_58.c_cc[1];
  local_98.c_cc[2] = local_58.c_cc[2];
  local_98.c_cc[3] = local_58.c_cc[3];
  local_98.c_cc[4] = local_58.c_cc[4];
  local_98.c_cc[5] = local_58.c_cc[5];
  local_98.c_cc[6] = local_58.c_cc[6];
  local_98.c_cc[7] = local_58.c_cc[7];
  local_98.c_cc[8] = local_58.c_cc[8];
  local_98.c_cc[9] = local_58.c_cc[9];
  local_98.c_cc[10] = local_58.c_cc[10];
  local_98.c_cc[0xb] = local_58.c_cc[0xb];
  local_98.c_cc[0xc] = local_58.c_cc[0xc];
  local_98.c_cc[0xd] = local_58.c_cc[0xd];
  local_98.c_cc[0xe] = local_58.c_cc[0xe];
  local_98.c_cc[0xf] = local_58.c_cc[0xf];
  local_98.c_cc[0x10] = local_58.c_cc[0x10];
  local_98.c_cc[0x11] = local_58.c_cc[0x11];
  local_98.c_cc[0x12] = local_58.c_cc[0x12];
  local_98.c_cc[0x13] = local_58.c_cc[0x13];
  local_98.c_cc[0x14] = local_58.c_cc[0x14];
  local_98.c_cc[0x15] = local_58.c_cc[0x15];
  local_98.c_cc[0x16] = local_58.c_cc[0x16];
  local_98.c_cc[0x17] = local_58.c_cc[0x17];
  local_98.c_cc[0x18] = local_58.c_cc[0x18];
  local_98.c_cc[0x19] = local_58.c_cc[0x19];
  local_98.c_cc[0x1a] = local_58.c_cc[0x1a];
  local_98.c_cc[0x1b] = local_58.c_cc[0x1b];
  local_98.c_cc[0x1c] = local_58.c_cc[0x1c];
  local_98.c_cc[0x1d] = local_58.c_cc[0x1d];
  local_98.c_cc[0x1e] = local_58.c_cc[0x1e];
  local_98.c_cc[0x1f] = local_58.c_cc[0x1f];
  local_98._49_3_ = local_58._49_3_;
  local_98.c_ispeed = local_58.c_ispeed;
  local_98.c_ospeed = local_58.c_ospeed;
  local_98._8_8_ = local_58._8_8_ & 0xfffffff5ffffffff;
  tcsetattr(0,0,&local_98);
  iVar1 = getchar();
  tcsetattr(0,0,&local_58);
  return (char)iVar1;
}

Assistant:

char Game::getch() {
    struct termios old_settings{}, new_settings{};

    tcgetattr(0, &old_settings); //grab old terminal i/o settings
    new_settings = old_settings; //make new settings same as old settings
    new_settings.c_lflag &= ~ICANON; //disable buffered i/o
    new_settings.c_lflag &= ~ECHO; //set echo mode
    tcsetattr(0, TCSANOW, &new_settings); //apply terminal io settings

    char ch;
    ch = (char) getchar();

    tcsetattr(0, TCSANOW, &old_settings);

    return ch;
}